

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

bool __thiscall
draco::MeshAttributeCornerTable::InitFromAttribute
          (MeshAttributeCornerTable *this,Mesh *mesh,CornerTable *table,PointAttribute *att)

{
  bool bVar1;
  long in_RDI;
  PointIndex sibling_point_id;
  PointIndex point_id;
  int i;
  CornerIndex act_sibling_c;
  CornerIndex act_c;
  VertexIndex v;
  CornerIndex opp_corner;
  FaceIndex f;
  CornerIndex c;
  CornerTable *in_stack_fffffffffffffe18;
  Mesh *in_stack_fffffffffffffe20;
  MeshAttributeCornerTable *in_stack_fffffffffffffe28;
  CornerIndex corner;
  long in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  CornerTable *in_stack_fffffffffffffe40;
  MeshAttributeCornerTable *in_stack_fffffffffffffe48;
  ValenceCache<draco::MeshAttributeCornerTable> *in_stack_fffffffffffffe50;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_164;
  reference local_160;
  uint local_14c;
  uint local_148;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_144;
  reference local_140;
  uint local_12c;
  uint local_128;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_124;
  reference local_120;
  uint local_10c;
  uint local_108;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_104;
  reference local_100;
  reference local_f0;
  reference local_e0;
  uint local_cc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_c8;
  uint local_c4;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  ThisIndexType local_b0;
  uint local_ac;
  ThisIndexType local_a8;
  int local_a4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_a0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_9c;
  reference local_98;
  uint local_84;
  uint local_80;
  ThisIndexType local_7c;
  reference local_78;
  uint local_68;
  uint local_64;
  ThisIndexType local_60;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_5c;
  reference local_58;
  uint local_44;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_2c [10];
  bool local_1;
  
  bVar1 = InitEmpty(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (bVar1) {
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCache(in_stack_fffffffffffffe50);
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCacheInaccurate
              (in_stack_fffffffffffffe50);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(local_2c,0);
    while( true ) {
      local_30 = CornerTable::num_corners((CornerTable *)0x18fcc4);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<(local_2c,&local_30);
      if (!bVar1) break;
      local_38 = local_2c[0].value_;
      local_3c = (uint)CornerTable::Face(in_stack_fffffffffffffe18,
                                         (CornerIndex)(uint)in_stack_fffffffffffffe20);
      local_34 = local_3c;
      bVar1 = CornerTable::IsDegenerated
                        ((CornerTable *)in_stack_fffffffffffffe48,
                         (FaceIndex)(uint)in_stack_fffffffffffffe50);
      if (!bVar1) {
        local_44 = local_2c[0].value_;
        local_40.value_ =
             (uint)CornerTable::Opposite(in_stack_fffffffffffffe18,(uint)in_stack_fffffffffffffe20);
        bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                          (&local_40,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                           &kInvalidCornerIndex);
        if (bVar1) {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(local_2c);
          local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38);
          std::_Bit_reference::operator=(&local_58,true);
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_5c);
          local_68 = local_2c[0].value_;
          local_64 = (uint)CornerTable::Next((CornerTable *)in_stack_fffffffffffffe28,
                                             (CornerIndex)(uint)in_stack_fffffffffffffe30);
          local_60.value_ =
               (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,
                                         (uint)in_stack_fffffffffffffe30);
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(&local_5c,&local_60);
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_5c);
          local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38);
          std::_Bit_reference::operator=(&local_78,true);
          local_84 = local_2c[0].value_;
          local_80 = (uint)CornerTable::Previous
                                     ((CornerTable *)in_stack_fffffffffffffe28,
                                      (CornerIndex)(uint)in_stack_fffffffffffffe30);
          local_7c.value_ =
               (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,
                                         (uint)in_stack_fffffffffffffe30);
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(&local_5c,&local_7c);
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_5c);
          local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38);
          std::_Bit_reference::operator=(&local_98,true);
        }
        else {
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                            (&local_40,local_2c);
          if (!bVar1) {
            local_9c.value_ = local_2c[0].value_;
            local_a0.value_ = local_40.value_;
            for (local_a4 = 0; local_a4 < 2; local_a4 = local_a4 + 1) {
              local_ac = local_9c.value_;
              local_a8.value_ =
                   (uint)CornerTable::Next((CornerTable *)in_stack_fffffffffffffe28,
                                           (uint)in_stack_fffffffffffffe30);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_9c,&local_a8);
              local_b4 = local_a0.value_;
              local_b0.value_ =
                   (uint)CornerTable::Previous
                                   ((CornerTable *)in_stack_fffffffffffffe28,
                                    (uint)in_stack_fffffffffffffe30);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_a0,&local_b0);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_9c);
              local_b8 = (uint)Mesh::CornerToPointId
                                         ((Mesh *)in_stack_fffffffffffffe28,
                                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_a0);
              local_bc = (uint)Mesh::CornerToPointId
                                         ((Mesh *)in_stack_fffffffffffffe28,
                                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
              local_c4 = local_b8;
              local_c0.value_ =
                   (uint)PointAttribute::mapped_index
                                   ((PointAttribute *)in_stack_fffffffffffffe18,
                                    (uint)in_stack_fffffffffffffe20);
              local_cc = local_bc;
              local_c8.value_ =
                   (uint)PointAttribute::mapped_index
                                   ((PointAttribute *)in_stack_fffffffffffffe18,
                                    (uint)in_stack_fffffffffffffe20);
              bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator!=
                                (&local_c0,&local_c8);
              corner.value_ = (uint)in_stack_fffffffffffffe30;
              if (bVar1) {
                *(undefined1 *)(in_RDI + 0x50) = 0;
                IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(local_2c);
                local_e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)
                                      in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_e0,true);
                IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_40);
                local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)
                                      in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_f0,true);
                in_stack_fffffffffffffe20 = (Mesh *)(in_RDI + 0x28);
                in_stack_fffffffffffffe18 = *(CornerTable **)(in_RDI + 0xa0);
                local_10c = local_2c[0].value_;
                local_108 = (uint)CornerTable::Next((CornerTable *)in_stack_fffffffffffffe28,corner)
                ;
                local_104.value_ =
                     (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,corner);
                IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_104);
                local_100 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                      ((vector<bool,_std::allocator<bool>_> *)
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_100,true);
                in_stack_fffffffffffffe30 = in_RDI + 0x28;
                in_stack_fffffffffffffe28 = *(MeshAttributeCornerTable **)(in_RDI + 0xa0);
                local_12c = local_2c[0].value_;
                local_128 = (uint)CornerTable::Previous
                                            ((CornerTable *)in_stack_fffffffffffffe28,
                                             (CornerIndex)(uint)in_stack_fffffffffffffe30);
                local_124.value_ =
                     (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,
                                               (uint)in_stack_fffffffffffffe30);
                IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_124);
                local_120 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                      ((vector<bool,_std::allocator<bool>_> *)
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_120,true);
                in_stack_fffffffffffffe40 = (CornerTable *)(in_RDI + 0x28);
                in_stack_fffffffffffffe38 = *(size_type *)(in_RDI + 0xa0);
                local_14c = local_40.value_;
                local_148 = (uint)CornerTable::Next((CornerTable *)in_stack_fffffffffffffe28,
                                                    (CornerIndex)(uint)in_stack_fffffffffffffe30);
                local_144.value_ =
                     (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,
                                               (uint)in_stack_fffffffffffffe30);
                IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_144);
                local_140 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                      ((vector<bool,_std::allocator<bool>_> *)
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_140,true);
                in_stack_fffffffffffffe50 =
                     (ValenceCache<draco::MeshAttributeCornerTable> *)(in_RDI + 0x28);
                in_stack_fffffffffffffe48 = *(MeshAttributeCornerTable **)(in_RDI + 0xa0);
                CornerTable::Previous
                          ((CornerTable *)in_stack_fffffffffffffe28,
                           (CornerIndex)(uint)in_stack_fffffffffffffe30);
                local_164.value_ =
                     (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffe28,
                                               (uint)in_stack_fffffffffffffe30);
                IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_164);
                local_160 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                      ((vector<bool,_std::allocator<bool>_> *)
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                std::_Bit_reference::operator=(&local_160,true);
                break;
              }
            }
          }
        }
      }
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(local_2c);
    }
    RecomputeVertices(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      (PointAttribute *)in_stack_fffffffffffffe18);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MeshAttributeCornerTable::InitFromAttribute(const Mesh *mesh,
                                                 const CornerTable *table,
                                                 const PointAttribute *att) {
  if (!InitEmpty(table)) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();

  // Find all necessary data for encoding attributes. For now we check which of
  // the mesh vertices is part of an attribute seam, because seams require
  // special handling.
  for (CornerIndex c(0); c < corner_table_->num_corners(); ++c) {
    const FaceIndex f = corner_table_->Face(c);
    if (corner_table_->IsDegenerated(f)) {
      continue;  // Ignore corners on degenerated faces.
    }
    const CornerIndex opp_corner = corner_table_->Opposite(c);
    if (opp_corner == kInvalidCornerIndex) {
      // Boundary. Mark it as seam edge.
      is_edge_on_seam_[c.value()] = true;
      // Mark seam vertices.
      VertexIndex v;
      v = corner_table_->Vertex(corner_table_->Next(c));
      is_vertex_on_seam_[v.value()] = true;
      v = corner_table_->Vertex(corner_table_->Previous(c));
      is_vertex_on_seam_[v.value()] = true;
      continue;
    }
    if (opp_corner < c) {
      continue;  // Opposite corner was already processed.
    }

    CornerIndex act_c(c), act_sibling_c(opp_corner);
    for (int i = 0; i < 2; ++i) {
      // Get the sibling corners. I.e., the two corners attached to the same
      // vertex but divided by the seam edge.
      act_c = corner_table_->Next(act_c);
      act_sibling_c = corner_table_->Previous(act_sibling_c);
      const PointIndex point_id = mesh->CornerToPointId(act_c.value());
      const PointIndex sibling_point_id =
          mesh->CornerToPointId(act_sibling_c.value());
      if (att->mapped_index(point_id) != att->mapped_index(sibling_point_id)) {
        no_interior_seams_ = false;
        is_edge_on_seam_[c.value()] = true;
        is_edge_on_seam_[opp_corner.value()] = true;
        // Mark seam vertices.
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Next(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_
            [corner_table_->Vertex(corner_table_->Next(opp_corner)).value()] =
                true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(opp_corner))
                               .value()] = true;
        break;
      }
    }
  }
  RecomputeVertices(mesh, att);
  return true;
}